

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

RPCHelpMan * wallet::lockunspent(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffeb48;
  allocator<RPCArg> *paVar1;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffeb50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb58;
  undefined4 in_stack_ffffffffffffeb60;
  VType in_stack_ffffffffffffeb64;
  UniValue *in_stack_ffffffffffffeb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb80;
  UniValue *in_stack_ffffffffffffeb88;
  iterator in_stack_ffffffffffffeb90;
  RPCArgOptions *in_stack_ffffffffffffeb98;
  string *in_stack_ffffffffffffeba0;
  undefined7 in_stack_ffffffffffffeba8;
  undefined1 in_stack_ffffffffffffebaf;
  undefined4 in_stack_ffffffffffffebb0;
  Type in_stack_ffffffffffffebb4;
  string *in_stack_ffffffffffffebb8;
  undefined4 in_stack_ffffffffffffebc0;
  Type in_stack_ffffffffffffebc4;
  undefined4 in_stack_ffffffffffffebc8;
  Type in_stack_ffffffffffffebcc;
  RPCArg *in_stack_ffffffffffffebd0;
  undefined1 *local_1418;
  RPCArgOptions *in_stack_ffffffffffffebf0;
  undefined1 *local_1400;
  undefined1 *local_13e8;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *in_stack_ffffffffffffedb0;
  undefined1 local_1238 [37];
  allocator<char> local_1213;
  allocator<char> local_1212;
  allocator<char> local_1211;
  allocator<char> local_1210;
  allocator<char> local_120f;
  allocator<char> local_120e;
  allocator<char> local_120d;
  allocator<char> local_120c;
  allocator<char> local_120b;
  allocator<char> local_120a;
  allocator<char> local_1209;
  pointer local_1208;
  pointer pRStack_1200;
  undefined1 local_11f8 [22];
  undefined1 local_11e2;
  RPCResults local_11e1;
  undefined1 local_11c7;
  undefined1 local_11c6 [2];
  undefined1 local_11c4 [10];
  allocator<char> local_11ba;
  allocator<char> local_11b9 [8];
  allocator<char> local_11b1 [32];
  allocator<char> local_1191;
  undefined4 local_1190;
  allocator<char> local_1189 [30];
  allocator<char> local_116b;
  allocator<char> local_116a;
  allocator<char> local_1169 [8];
  allocator<char> local_1161 [31];
  allocator<char> local_1142;
  allocator<char> local_1141 [321];
  undefined8 local_1000;
  undefined1 local_cb8;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined1 local_c78;
  undefined1 local_c77;
  allocator<RPCArg> local_b78 [40];
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined1 local_b38;
  undefined1 local_b37;
  allocator<RPCArg> local_b30 [40];
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined1 local_af0;
  undefined1 local_aef;
  undefined1 local_ae8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined1 local_aa8;
  undefined1 local_aa7;
  undefined1 local_a00;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined1 local_9c0;
  undefined1 local_9bf;
  undefined1 local_918 [528];
  undefined1 local_708 [160];
  undefined1 local_668 [264];
  undefined1 local_560 [280];
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360 [528];
  string local_150 [8];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  local_1169[1] = (allocator<char>)0x0;
  local_1169[2] = (allocator<char>)0x0;
  local_1169[3] = (allocator<char>)0x0;
  local_1169[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeb58,&in_stack_ffffffffffffeb50->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  local_448 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60));
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeb48);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
                 in_stack_ffffffffffffebb8,in_stack_ffffffffffffebb4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
                 in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60));
  UniValue::UniValue(in_stack_ffffffffffffeb68,in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb58);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  local_1190 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeb58,&in_stack_ffffffffffffeb50->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  local_11b9._1_4_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeb58,&in_stack_ffffffffffffeb50->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  local_a00 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60));
  local_9d8 = 0;
  uStack_9d0 = 0;
  local_9c8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeb48);
  local_9c0 = 0;
  local_9bf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
                 in_stack_ffffffffffffebb8,in_stack_ffffffffffffebb4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
                 in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  local_11c4._4_4_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeb58,&in_stack_ffffffffffffeb50->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  local_ae8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60));
  local_ac0 = 0;
  uStack_ab8 = 0;
  local_ab0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeb48);
  local_aa8 = 0;
  local_aa7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
                 in_stack_ffffffffffffebb8,in_stack_ffffffffffffebb4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
                 in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffeb48);
  __l._M_len = (size_type)in_stack_ffffffffffffeb98;
  __l._M_array = in_stack_ffffffffffffeb90;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeb88,__l,
             (allocator_type *)in_stack_ffffffffffffeb80);
  local_b30[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60));
  local_b08 = 0;
  uStack_b00 = 0;
  local_af8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeb48);
  local_af0 = 0;
  local_aef = 0;
  paVar1 = local_b30;
  RPCArg::RPCArg(in_stack_ffffffffffffebd0,
                 (string *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8),
                 in_stack_ffffffffffffebc4,(Fallback *)in_stack_ffffffffffffebb8,
                 (string *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
                 in_stack_ffffffffffffebf0);
  std::allocator<RPCArg>::allocator(paVar1);
  __l_00._M_len = (size_type)in_stack_ffffffffffffeb98;
  __l_00._M_array = in_stack_ffffffffffffeb90;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeb88,__l_00,
             (allocator_type *)in_stack_ffffffffffffeb80);
  local_b78[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60));
  local_b50 = 0;
  uStack_b48 = 0;
  local_b40 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_b38 = 0;
  local_b37 = 0;
  paVar1 = local_b78;
  RPCArg::RPCArg(in_stack_ffffffffffffebd0,
                 (string *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8),
                 in_stack_ffffffffffffebc4,(Fallback *)in_stack_ffffffffffffebb8,
                 (string *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
                 in_stack_ffffffffffffebf0);
  name = local_150;
  this_00 = (RPCHelpMan *)local_11c4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  local_11c6[1] = '\0';
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffeb88,(bool *)in_stack_ffffffffffffeb80);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50);
  description = (string *)local_11c6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  local_cb8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60));
  local_c90 = 0;
  uStack_c88 = 0;
  local_c80 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_c78 = 0;
  local_c77 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
                 in_stack_ffffffffffffebb8,in_stack_ffffffffffffebb4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
                 in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_11c7;
  std::allocator<RPCArg>::allocator(paVar1);
  __l_01._M_len = (size_type)in_stack_ffffffffffffeb98;
  __l_01._M_array = in_stack_ffffffffffffeb90;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeb88,__l_01,
             (allocator_type *)in_stack_ffffffffffffeb80);
  results = &local_11e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  examples = (RPCExamples *)&local_11e2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  local_1208 = (pointer)0x0;
  pRStack_1200 = (pointer)0x0;
  local_11f8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar1);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffebd0,in_stack_ffffffffffffebcc,
             (string *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
             in_stack_ffffffffffffebb8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
             (bool)in_stack_ffffffffffffebaf);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  HelpExampleCli(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
                 in_stack_ffffffffffffeb58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
                 (char *)in_stack_ffffffffffffeb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  HelpExampleCli(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  std::operator+(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
                 (char *)in_stack_ffffffffffffeb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  HelpExampleCli(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  std::operator+(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
                 (char *)in_stack_ffffffffffffeb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  HelpExampleCli(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  std::operator+(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
                 (char *)in_stack_ffffffffffffeb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  HelpExampleCli(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  std::operator+(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
                 (char *)in_stack_ffffffffffffeb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb98,(char *)in_stack_ffffffffffffeb90,
             (allocator<char> *)in_stack_ffffffffffffeb88);
  HelpExampleRpc(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  std::operator+(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  RPCExamples::RPCExamples((RPCExamples *)paVar1,(string *)0x53684b);
  this = (RPCArg *)local_1238;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::lockunspent()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffeb58,(anon_class_1_0_00000001 *)in_stack_ffffffffffffeb50);
  RPCHelpMan::RPCHelpMan(this_00,name,description,args,results,examples,in_stack_ffffffffffffedb0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1238 + 0x24));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1213);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1212);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1211);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1210);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_120f);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_120e);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_120d);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_120c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_120b);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_120a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1209);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb58);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_11e2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_11e1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeb58);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_13e8 = local_48;
  do {
    local_13e8 = local_13e8 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_13e8 != local_360);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_11c6);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_11c4);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeb58);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_1400 = local_560;
  do {
    local_1400 = local_1400 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_1400 != local_668);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeb58);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_1418 = local_708;
  do {
    local_1418 = local_1418 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_1418 != local_918);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_11c4 + 3));
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_11ba);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_11b9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_11b1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1191);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1189);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_116b);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_116a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1169);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1161);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1142);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1141);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan lockunspent()
{
    return RPCHelpMan{"lockunspent",
                "\nUpdates list of temporarily unspendable outputs.\n"
                "Temporarily lock (unlock=false) or unlock (unlock=true) specified transaction outputs.\n"
                "If no transaction outputs are specified when unlocking then all current locked transaction outputs are unlocked.\n"
                "A locked transaction output will not be chosen by automatic coin selection, when spending bitcoins.\n"
                "Manually selected coins are automatically unlocked.\n"
                "Locks are stored in memory only, unless persistent=true, in which case they will be written to the\n"
                "wallet database and loaded on node start. Unwritten (persistent=false) locks are always cleared\n"
                "(by virtue of process exit) when a node stops or fails. Unlocking will clear both persistent and not.\n"
                "Also see the listunspent call\n",
                {
                    {"unlock", RPCArg::Type::BOOL, RPCArg::Optional::NO, "Whether to unlock (true) or lock (false) the specified transactions"},
                    {"transactions", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "The transaction outputs and within each, the txid (string) vout (numeric).",
                        {
                            {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                                {
                                    {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                                    {"vout", RPCArg::Type::NUM, RPCArg::Optional::NO, "The output number"},
                                },
                            },
                        },
                    },
                    {"persistent", RPCArg::Type::BOOL, RPCArg::Default{false}, "Whether to write/erase this lock in the wallet database, or keep the change in memory only. Ignored for unlocking."},
                },
                RPCResult{
                    RPCResult::Type::BOOL, "", "Whether the command was successful or not"
                },
                RPCExamples{
            "\nList the unspent transactions\n"
            + HelpExampleCli("listunspent", "") +
            "\nLock an unspent transaction\n"
            + HelpExampleCli("lockunspent", "false \"[{\\\"txid\\\":\\\"a08e6907dbbd3d809776dbfc5d82e371b764ed838b5655e72f463568df1aadf0\\\",\\\"vout\\\":1}]\"") +
            "\nList the locked transactions\n"
            + HelpExampleCli("listlockunspent", "") +
            "\nUnlock the transaction again\n"
            + HelpExampleCli("lockunspent", "true \"[{\\\"txid\\\":\\\"a08e6907dbbd3d809776dbfc5d82e371b764ed838b5655e72f463568df1aadf0\\\",\\\"vout\\\":1}]\"") +
            "\nLock the transaction persistently in the wallet database\n"
            + HelpExampleCli("lockunspent", "false \"[{\\\"txid\\\":\\\"a08e6907dbbd3d809776dbfc5d82e371b764ed838b5655e72f463568df1aadf0\\\",\\\"vout\\\":1}]\" true") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("lockunspent", "false, \"[{\\\"txid\\\":\\\"a08e6907dbbd3d809776dbfc5d82e371b764ed838b5655e72f463568df1aadf0\\\",\\\"vout\\\":1}]\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    bool fUnlock = request.params[0].get_bool();

    const bool persistent{request.params[2].isNull() ? false : request.params[2].get_bool()};

    if (request.params[1].isNull()) {
        if (fUnlock) {
            if (!pwallet->UnlockAllCoins())
                throw JSONRPCError(RPC_WALLET_ERROR, "Unlocking coins failed");
        }
        return true;
    }

    const UniValue& output_params = request.params[1].get_array();

    // Create and validate the COutPoints first.

    std::vector<COutPoint> outputs;
    outputs.reserve(output_params.size());

    for (unsigned int idx = 0; idx < output_params.size(); idx++) {
        const UniValue& o = output_params[idx].get_obj();

        RPCTypeCheckObj(o,
            {
                {"txid", UniValueType(UniValue::VSTR)},
                {"vout", UniValueType(UniValue::VNUM)},
            });

        const Txid txid = Txid::FromUint256(ParseHashO(o, "txid"));
        const int nOutput = o.find_value("vout").getInt<int>();
        if (nOutput < 0) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, vout cannot be negative");
        }

        const COutPoint outpt(txid, nOutput);

        const auto it = pwallet->mapWallet.find(outpt.hash);
        if (it == pwallet->mapWallet.end()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, unknown transaction");
        }

        const CWalletTx& trans = it->second;

        if (outpt.n >= trans.tx->vout.size()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, vout index out of bounds");
        }

        if (pwallet->IsSpent(outpt)) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, expected unspent output");
        }

        const bool is_locked = pwallet->IsLockedCoin(outpt);

        if (fUnlock && !is_locked) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, expected locked output");
        }

        if (!fUnlock && is_locked && !persistent) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, output already locked");
        }

        outputs.push_back(outpt);
    }

    std::unique_ptr<WalletBatch> batch = nullptr;
    // Unlock is always persistent
    if (fUnlock || persistent) batch = std::make_unique<WalletBatch>(pwallet->GetDatabase());

    // Atomically set (un)locked status for the outputs.
    for (const COutPoint& outpt : outputs) {
        if (fUnlock) {
            if (!pwallet->UnlockCoin(outpt, batch.get())) throw JSONRPCError(RPC_WALLET_ERROR, "Unlocking coin failed");
        } else {
            if (!pwallet->LockCoin(outpt, batch.get())) throw JSONRPCError(RPC_WALLET_ERROR, "Locking coin failed");
        }
    }

    return true;
},
    };
}